

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::InjectBailOut(IRBuilder *this,uint offset)

{
  bool bVar1;
  JitArenaAllocator *pJVar2;
  BailOutInfo *this_00;
  BailOutInstrTemplate<IR::Instr> *this_01;
  BailOutInstr *instr;
  TrackAllocData local_58;
  BailOutInfo *local_30;
  BailOutInfo *bailOutInfo;
  IntConstOpnd *pIStack_20;
  uint bailOutOffset;
  IntConstOpnd *opnd;
  IRBuilder *pIStack_10;
  uint offset_local;
  IRBuilder *this_local;
  
  opnd._4_4_ = offset;
  pIStack_10 = this;
  bVar1 = Func::IsSimpleJit(this->m_func);
  if (!bVar1) {
    pIStack_20 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    bailOutInfo._4_4_ = opnd._4_4_;
    if (opnd._4_4_ == 0xffffffff) {
      bailOutInfo._4_4_ = IR::Instr::GetByteCodeOffset(this->m_lastInstr);
    }
    pJVar2 = this->m_func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&BailOutInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
               ,0xb9);
    pJVar2 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar2,&local_58);
    this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,pJVar2,0x4e98c0);
    BailOutInfo::BailOutInfo(this_00,bailOutInfo._4_4_,this->m_func);
    local_30 = this_00;
    this_01 = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailOnEqual,BailOutInjected,this_00,this_00->bailOutFunc);
    IR::Instr::SetSrc1(&this_01->super_Instr,&pIStack_20->super_Opnd);
    IR::Instr::SetSrc2(&this_01->super_Instr,&pIStack_20->super_Opnd);
    AddInstr(this,&this_01->super_Instr,opnd._4_4_);
  }
  return;
}

Assistant:

void
IRBuilder::InjectBailOut(uint offset)
{
    if(m_func->IsSimpleJit())
    {
        return; // bailout injection is only applicable to full JIT
    }

    IR::IntConstOpnd * opnd = IR::IntConstOpnd::New(0, TyInt32, m_func);
    uint bailOutOffset = offset;
    if (bailOutOffset == Js::Constants::NoByteCodeOffset)
    {
        bailOutOffset = m_lastInstr->GetByteCodeOffset();
    }
    BailOutInfo * bailOutInfo = JitAnew(m_func->m_alloc, BailOutInfo, bailOutOffset, m_func);
    IR::BailOutInstr * instr = IR::BailOutInstr::New(Js::OpCode::BailOnEqual, IR::BailOutInjected, bailOutInfo, bailOutInfo->bailOutFunc);
    instr->SetSrc1(opnd);
    instr->SetSrc2(opnd);
    this->AddInstr(instr, offset);
}